

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# collada.cpp
# Opt level: O0

Vector3D * CGL::Collada::spectrum_from_string(string *Vector3D_string)

{
  _Ios_Openmode _Var1;
  string *in_RSI;
  Vector3D *in_RDI;
  stringstream ss;
  Vector3D *s;
  stringstream local_198 [408];
  
  Vector3D::Vector3D(in_RDI);
  _Var1 = std::operator|(_S_out,_S_in);
  std::__cxx11::stringstream::stringstream(local_198,in_RSI,_Var1);
  std::istream::operator>>((istream *)local_198,(double *)in_RDI);
  std::istream::operator>>((istream *)local_198,&(in_RDI->field_0).field_0.y);
  std::istream::operator>>((istream *)local_198,&(in_RDI->field_0).field_0.z);
  std::__cxx11::stringstream::~stringstream(local_198);
  return in_RDI;
}

Assistant:

inline Vector3D spectrum_from_string ( string Vector3D_string ) {

  Vector3D s;

  stringstream ss (Vector3D_string);
  ss >> s.r;
  ss >> s.g;
  ss >> s.b;

  return s;

}